

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int os_date(lua_State *L)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *local_20b8;
  char *buff;
  size_t reslen;
  luaL_Buffer b;
  tm *ptStack_78;
  char cc [4];
  tm *stm;
  tm tmr;
  char *se;
  time_t t;
  char *s;
  size_t slen;
  lua_State *L_local;
  
  slen = (size_t)L;
  t = (time_t)luaL_optlstring(L,1,"%c",(size_t *)&s);
  iVar1 = lua_type((lua_State *)slen,2);
  if (iVar1 < 1) {
    local_20b8 = (char *)time((time_t *)0x0);
  }
  else {
    local_20b8 = (char *)l_checktime((lua_State *)slen,2);
  }
  se = local_20b8;
  tmr.__tm_zone = s + t;
  if (*(char *)t == '!') {
    ptStack_78 = (tm *)gmtime_r((time_t *)&se,(tm *)&stm);
    t = t + 1;
  }
  else {
    ptStack_78 = (tm *)localtime_r((time_t *)&se,(tm *)&stm);
  }
  if (ptStack_78 == (tm *)0x0) {
    L_local._4_4_ =
         luaL_error((lua_State *)slen,"time result cannot be represented in this installation");
  }
  else {
    iVar1 = strcmp((char *)t,"*t");
    if (iVar1 == 0) {
      lua_createtable((lua_State *)slen,0,9);
      setallfields((lua_State *)slen,ptStack_78);
    }
    else {
      b.initb[0x1ffc] = '%';
      luaL_buffinit((lua_State *)slen,(luaL_Buffer *)&reslen);
      while ((ulong)t < tmr.__tm_zone) {
        if (*(char *)t == '%') {
          __s = luaL_prepbuffsize((luaL_Buffer *)&reslen,0xfa);
          t = t + 1;
          t = (time_t)checkoption((lua_State *)slen,(char *)t,(long)tmr.__tm_zone - t,
                                  b.initb + 0x1ffd);
          sVar2 = strftime(__s,0xfa,b.initb + 0x1ffc,(tm *)ptStack_78);
          b.size = sVar2 + b.size;
        }
        else {
          if (b.b <= b.size) {
            luaL_prepbuffsize((luaL_Buffer *)&reslen,1);
          }
          *(undefined1 *)(reslen + b.size) = *(undefined1 *)t;
          b.size = b.size + 1;
          t = t + 1;
        }
      }
      luaL_pushresult((luaL_Buffer *)&reslen);
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int os_date (lua_State *L) {
  size_t slen;
  const char *s = luaL_optlstring(L, 1, "%c", &slen);
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  const char *se = s + slen;  /* 's' end */
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    return luaL_error(L,
                 "time result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (s < se) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s++;  /* skip '%' */
        s = checkoption(L, s, se - s, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}